

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>,_20>::TPZManVector
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>,_20> *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  ulong in_RSI;
  undefined8 *in_RDI;
  ulong uVar4;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *in_stack_ffffffffffffff60;
  ulong *local_80;
  int64_t in_stack_ffffffffffffffa8;
  TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_> *in_stack_ffffffffffffffb0;
  undefined8 *local_28;
  
  TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>::TPZVec
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *in_RDI = &PTR__TPZManVector_023e9b70;
  local_28 = in_RDI + 4;
  do {
    TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::TPZAutoPointer(in_stack_ffffffffffffff60);
    local_28 = local_28 + 1;
  } while (local_28 != in_RDI + 0x18);
  if ((long)in_RSI < 0x15) {
    in_RDI[1] = in_RDI + 4;
    in_RDI[2] = in_RSI;
    in_RDI[3] = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    uVar4 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar4 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    puVar3 = (ulong *)operator_new__(uVar4);
    *puVar3 = in_RSI;
    puVar3 = puVar3 + 1;
    if (in_RSI != 0) {
      local_80 = puVar3;
      do {
        TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::TPZAutoPointer
                  (in_stack_ffffffffffffff60);
        local_80 = local_80 + 1;
      } while (local_80 != puVar3 + in_RSI);
    }
    in_RDI[1] = puVar3;
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}